

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

void wait_for_comm_processes(void)

{
  uchar local_16;
  undefined1 local_15;
  byte local_14;
  byte local_13;
  undefined1 local_12;
  uchar local_11;
  int iStack_10;
  uchar d [6];
  int slot;
  int pid;
  
  memset(&local_16,0,6);
  local_16 = 'W';
  write(UnixPipeOut,&local_16,6);
  SAFEREAD(UnixPipeIn,&local_16,6);
  d[3] = local_16;
  d[2] = local_15;
  d[4] = local_12;
  d[5] = local_11;
  while (d._2_4_ != 0) {
    iStack_10 = find_process_slot(d._2_4_);
    if (-1 < iStack_10) {
      if (local_14 == 0) {
        UJ[iStack_10].status = (uint)local_13;
      }
      else {
        UJ[iStack_10].status = (uint)local_14 << 8;
      }
    }
    memset(&local_16,0,6);
    local_16 = 'W';
    write(UnixPipeOut,&local_16,6);
    SAFEREAD(UnixPipeIn,&local_16,6);
    d[3] = local_16;
    d[2] = local_15;
    d[4] = local_12;
    d[5] = local_11;
  }
  return;
}

Assistant:

void wait_for_comm_processes(void) {
  int pid;
  int slot;
  unsigned char d[6];

  memset(d, 0, sizeof(d));
  d[0] = 'W';
  write(UnixPipeOut, d, 6);
  SAFEREAD(UnixPipeIn, d, 6);

  pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  while (pid != 0) {
    slot = find_process_slot(pid);
    /* Ignore processes that we didn't start (shouldn't happen but
       occasionally does) */
    if (slot >= 0) {
      if (d[2] == 0) {
        DBPRINT(("Process %d exited status %d\n", pid, d[3]));
        UJ[slot].status = d[3];
      } else {
        DBPRINT(("Process %d terminated with signal %d\n", pid, d[2]));
        UJ[slot].status = (d[2] << 8);
      }
    }
    /* Look for another stopped process. */
    memset(d, 0, sizeof(d));
    d[0] = 'W';
    write(UnixPipeOut, d, 6);
    SAFEREAD(UnixPipeIn, d, 6);

    pid = (d[0] << 8) | d[1] | (d[4] << 16) | (d[5] << 24);
  }
}